

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv4address.cpp
# Opt level: O0

RTPAddress * __thiscall
jrtplib::RTPIPv4Address::CreateCopy(RTPIPv4Address *this,RTPMemoryManager *mgr)

{
  RTPIPv4Address *this_00;
  RTPIPv4Address *a;
  RTPMemoryManager *mgr_local;
  RTPIPv4Address *this_local;
  
  this_00 = (RTPIPv4Address *)operator_new(0x18,mgr,0x17);
  RTPIPv4Address(this_00,*(uint32_t *)&(this->super_RTPAddress).field_0xc,this->port,false);
  return &this_00->super_RTPAddress;
}

Assistant:

RTPAddress *RTPIPv4Address::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPIPv4Address *a = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv4Address(ip,port);
	return a;
}